

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O3

boolean decode_mcu(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  uint *puVar1;
  jpeg_entropy_decoder *pjVar2;
  d_derived_tbl *htbl;
  d_derived_tbl *htbl_00;
  jpeg_marker_reader *pjVar3;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var4;
  long lVar5;
  boolean bVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  _func_void_j_decompress_ptr *p_Var14;
  ulong uVar15;
  uint uVar16;
  jpeg_entropy_decoder *pjVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  JBLOCKROW paJVar21;
  long lVar22;
  jpeg_source_mgr *pjVar23;
  uint uVar24;
  byte *pbVar25;
  byte *pbVar26;
  bitread_working_state br_state;
  JBLOCKROW local_a8;
  bitread_working_state local_98;
  jpeg_entropy_decoder *local_68;
  JBLOCKROW *local_60;
  undefined8 local_58;
  _func_void_j_decompress_ptr *p_Stack_50;
  jpeg_source_mgr *local_40;
  ulong local_38;
  
  pjVar2 = cinfo->entropy;
  uVar13 = cinfo->restart_interval;
  if ((uVar13 != 0) && (*(int *)&pjVar2[2].decode_mcu == 0)) {
    iVar18 = *(int *)&pjVar2[1].decode_mcu;
    iVar12 = iVar18 + 7;
    if (-1 < iVar18) {
      iVar12 = iVar18;
    }
    pjVar3 = cinfo->marker;
    puVar1 = &pjVar3->discarded_bytes;
    *puVar1 = *puVar1 + (iVar12 >> 3);
    *(undefined4 *)&pjVar2[1].decode_mcu = 0;
    bVar6 = (*pjVar3->read_restart_marker)(cinfo);
    if (bVar6 == 0) {
      return 0;
    }
    if (0 < cinfo->comps_in_scan) {
      lVar22 = 0;
      do {
        (&pjVar2[1].insufficient_data)[lVar22] = 0;
        lVar22 = lVar22 + 1;
      } while (lVar22 < cinfo->comps_in_scan);
    }
    *(uint *)&pjVar2[2].decode_mcu = cinfo->restart_interval;
    if (cinfo->unread_marker == 0) {
      pjVar2->insufficient_data = 0;
    }
  }
  pjVar23 = cinfo->src;
  uVar9 = pjVar23->bytes_in_buffer;
  iVar18 = cinfo->blocks_in_MCU;
  local_98.bytes_in_buffer = uVar9;
  local_68 = pjVar2;
  if ((uVar9 < (ulong)((long)iVar18 << 9)) || (cinfo->unread_marker != 0)) {
    if (pjVar2->insufficient_data != 0) goto LAB_00142444;
    pjVar17 = cinfo->entropy;
    pbVar25 = pjVar23->next_input_byte;
  }
  else {
    if (pjVar2->insufficient_data != 0) goto LAB_00142444;
    pjVar17 = cinfo->entropy;
    pbVar25 = pjVar23->next_input_byte;
    if (uVar13 == 0) {
      p_Var14 = pjVar17[1].start_pass;
      iVar12 = *(int *)&pjVar17[1].decode_mcu;
      local_98.next_input_byte = *(JOCTET **)&pjVar17[1].insufficient_data;
      local_98.bytes_in_buffer = (size_t)pjVar17[2].start_pass;
      local_38 = uVar9;
      local_40 = pjVar23;
      pbVar26 = pbVar25;
      if (0 < iVar18) {
        local_60 = MCU_data;
        uVar13 = 0;
        lVar22 = 0;
        do {
          if (local_60 == (JBLOCKROW *)0x0) {
            paJVar21 = (JBLOCKROW)0x0;
          }
          else {
            paJVar21 = local_60[lVar22];
          }
          p_Var4 = (&pjVar17[5].decode_mcu)[lVar22];
          lVar5 = *(long *)(&pjVar17[8].insufficient_data + lVar22 * 2);
          iVar20 = iVar12;
          if (iVar12 < 0x11) {
            lVar8 = (long)p_Var14 * 0x100 + (ulong)*pbVar26;
            if ((ulong)*pbVar26 == 0xff) {
              if (pbVar26[1] == 0) {
                pbVar26 = pbVar26 + 2;
              }
              else {
                uVar13 = (uint)pbVar26[1];
                cinfo->unread_marker = uVar13;
                lVar8 = (long)p_Var14 * 0x100;
              }
            }
            else {
              pbVar26 = pbVar26 + 1;
            }
            lVar10 = lVar8 * 0x100 + (ulong)*pbVar26;
            if ((ulong)*pbVar26 == 0xff) {
              if (pbVar26[1] == 0) {
                pbVar26 = pbVar26 + 2;
              }
              else {
                uVar13 = (uint)pbVar26[1];
                cinfo->unread_marker = uVar13;
                lVar10 = lVar8 * 0x100;
              }
            }
            else {
              pbVar26 = pbVar26 + 1;
            }
            lVar8 = lVar10 * 0x100 + (ulong)*pbVar26;
            if ((ulong)*pbVar26 == 0xff) {
              if (pbVar26[1] == 0) {
                pbVar26 = pbVar26 + 2;
              }
              else {
                uVar13 = (uint)pbVar26[1];
                cinfo->unread_marker = uVar13;
                lVar8 = lVar10 * 0x100;
              }
            }
            else {
              pbVar26 = pbVar26 + 1;
            }
            lVar10 = lVar8 * 0x100 + (ulong)*pbVar26;
            if ((ulong)*pbVar26 == 0xff) {
              if (pbVar26[1] == 0) {
                pbVar26 = pbVar26 + 2;
              }
              else {
                uVar13 = (uint)pbVar26[1];
                cinfo->unread_marker = uVar13;
                lVar10 = lVar8 * 0x100;
              }
            }
            else {
              pbVar26 = pbVar26 + 1;
            }
            lVar8 = lVar10 * 0x100 + (ulong)*pbVar26;
            if ((ulong)*pbVar26 == 0xff) {
              if (pbVar26[1] == 0) {
                pbVar26 = pbVar26 + 2;
              }
              else {
                uVar13 = (uint)pbVar26[1];
                cinfo->unread_marker = uVar13;
                lVar8 = lVar10 * 0x100;
              }
            }
            else {
              pbVar26 = pbVar26 + 1;
            }
            p_Var14 = (_func_void_j_decompress_ptr *)(lVar8 * 0x100) + *pbVar26;
            iVar20 = iVar12 + 0x30;
            if ((ulong)*pbVar26 == 0xff) {
              if (pbVar26[1] == 0) {
                pbVar26 = pbVar26 + 2;
              }
              else {
                uVar13 = (uint)pbVar26[1];
                cinfo->unread_marker = uVar13;
                p_Var14 = (_func_void_j_decompress_ptr *)(lVar8 * 0x100);
              }
            }
            else {
              pbVar26 = pbVar26 + 1;
            }
          }
          uVar16 = *(uint *)(p_Var4 + (ulong)((uint)((ulong)p_Var14 >> ((char)iVar20 - 8U & 0x3f)) &
                                             0xff) * 4 + 0x128);
          uVar19 = (int)uVar16 >> 8;
          iVar12 = iVar20 - uVar19;
          if ((int)uVar19 < 9) {
            uVar16 = uVar16 & 0xff;
LAB_001426c5:
            if (uVar16 == 0) goto LAB_001426ec;
            if (iVar12 < 0x11) {
              lVar8 = (long)p_Var14 * 0x100 + (ulong)*pbVar26;
              if ((ulong)*pbVar26 == 0xff) {
                if (pbVar26[1] == 0) {
                  pbVar26 = pbVar26 + 2;
                }
                else {
                  uVar13 = (uint)pbVar26[1];
                  cinfo->unread_marker = uVar13;
                  lVar8 = (long)p_Var14 * 0x100;
                }
              }
              else {
                pbVar26 = pbVar26 + 1;
              }
              lVar10 = lVar8 * 0x100 + (ulong)*pbVar26;
              if ((ulong)*pbVar26 == 0xff) {
                if (pbVar26[1] == 0) {
                  pbVar26 = pbVar26 + 2;
                }
                else {
                  uVar13 = (uint)pbVar26[1];
                  cinfo->unread_marker = uVar13;
                  lVar10 = lVar8 * 0x100;
                }
              }
              else {
                pbVar26 = pbVar26 + 1;
              }
              lVar8 = lVar10 * 0x100 + (ulong)*pbVar26;
              if ((ulong)*pbVar26 == 0xff) {
                if (pbVar26[1] == 0) {
                  pbVar26 = pbVar26 + 2;
                }
                else {
                  uVar13 = (uint)pbVar26[1];
                  cinfo->unread_marker = uVar13;
                  lVar8 = lVar10 * 0x100;
                }
              }
              else {
                pbVar26 = pbVar26 + 1;
              }
              lVar10 = lVar8 * 0x100 + (ulong)*pbVar26;
              if ((ulong)*pbVar26 == 0xff) {
                if (pbVar26[1] == 0) {
                  pbVar26 = pbVar26 + 2;
                }
                else {
                  uVar13 = (uint)pbVar26[1];
                  cinfo->unread_marker = uVar13;
                  lVar10 = lVar8 * 0x100;
                }
              }
              else {
                pbVar26 = pbVar26 + 1;
              }
              lVar8 = lVar10 * 0x100 + (ulong)*pbVar26;
              if ((ulong)*pbVar26 == 0xff) {
                if (pbVar26[1] == 0) {
                  pbVar26 = pbVar26 + 2;
                }
                else {
                  uVar13 = (uint)pbVar26[1];
                  cinfo->unread_marker = uVar13;
                  lVar8 = lVar10 * 0x100;
                }
              }
              else {
                pbVar26 = pbVar26 + 1;
              }
              p_Var14 = (_func_void_j_decompress_ptr *)(lVar8 * 0x100) + *pbVar26;
              iVar12 = iVar12 + 0x30;
              if ((ulong)*pbVar26 == 0xff) {
                if (pbVar26[1] == 0) {
                  pbVar26 = pbVar26 + 2;
                }
                else {
                  uVar13 = (uint)pbVar26[1];
                  cinfo->unread_marker = uVar13;
                  p_Var14 = (_func_void_j_decompress_ptr *)(lVar8 * 0x100);
                }
              }
              else {
                pbVar26 = pbVar26 + 1;
              }
            }
            iVar12 = iVar12 - uVar16;
            uVar19 = -1 << ((byte)uVar16 & 0x1f);
            uVar24 = ~uVar19 & (uint)((ulong)p_Var14 >> ((byte)iVar12 & 0x3f));
            iVar20 = ((int)((-1 << ((byte)uVar16 - 1 & 0x1f)) + uVar24) >> 0x1f & uVar19 + 1) +
                     uVar24;
          }
          else {
            uVar16 = (uint)((ulong)p_Var14 >> ((byte)iVar12 & 0x3f)) &
                     ~(-1 << ((byte)(uVar16 >> 8) & 0x1f));
            uVar15 = (ulong)uVar16;
            uVar9 = (ulong)uVar19;
            if (*(long *)(p_Var4 + uVar9 * 8) < (long)uVar15) {
              uVar19 = ~uVar19;
              uVar11 = uVar9;
              do {
                uVar16 = (uint)(((ulong)p_Var14 >> ((ulong)(iVar20 + uVar19) & 0x3f) & 1) != 0) +
                         (int)uVar15 * 2;
                uVar15 = (ulong)uVar16;
                uVar9 = uVar11 + 1;
                uVar19 = uVar19 - 1;
                lVar8 = uVar11 * 8;
                uVar11 = uVar9;
              } while (*(long *)(p_Var4 + lVar8 + 8) < (long)(int)uVar16);
              uVar19 = (uint)uVar9;
              iVar12 = iVar20 - uVar19;
            }
            if ((int)uVar19 < 0x11) {
              uVar16 = (uint)*(byte *)(*(long *)(p_Var4 + 0x120) + 0x11 +
                                      (ulong)(uVar16 + *(int *)(p_Var4 + uVar9 * 8 + 0x90) & 0xff));
              goto LAB_001426c5;
            }
LAB_001426ec:
            iVar20 = 0;
          }
          if (*(int *)((long)&pjVar17[0xc].start_pass + lVar22 * 4) == 0) {
LAB_0014287c:
            if (((&pjVar17[0xd].insufficient_data)[lVar22] == 0) || (paJVar21 == (JBLOCKROW)0x0))
            goto LAB_00142c52;
            iVar20 = 1;
            do {
              if (iVar12 < 0x11) {
                lVar8 = (long)p_Var14 * 0x100 + (ulong)*pbVar26;
                if ((ulong)*pbVar26 == 0xff) {
                  if (pbVar26[1] == 0) {
                    pbVar26 = pbVar26 + 2;
                  }
                  else {
                    uVar13 = (uint)pbVar26[1];
                    cinfo->unread_marker = uVar13;
                    lVar8 = (long)p_Var14 * 0x100;
                  }
                }
                else {
                  pbVar26 = pbVar26 + 1;
                }
                lVar10 = lVar8 * 0x100 + (ulong)*pbVar26;
                if ((ulong)*pbVar26 == 0xff) {
                  if (pbVar26[1] == 0) {
                    pbVar26 = pbVar26 + 2;
                  }
                  else {
                    uVar13 = (uint)pbVar26[1];
                    cinfo->unread_marker = uVar13;
                    lVar10 = lVar8 * 0x100;
                  }
                }
                else {
                  pbVar26 = pbVar26 + 1;
                }
                lVar8 = lVar10 * 0x100 + (ulong)*pbVar26;
                if ((ulong)*pbVar26 == 0xff) {
                  if (pbVar26[1] == 0) {
                    pbVar26 = pbVar26 + 2;
                  }
                  else {
                    uVar13 = (uint)pbVar26[1];
                    cinfo->unread_marker = uVar13;
                    lVar8 = lVar10 * 0x100;
                  }
                }
                else {
                  pbVar26 = pbVar26 + 1;
                }
                lVar10 = lVar8 * 0x100 + (ulong)*pbVar26;
                if ((ulong)*pbVar26 == 0xff) {
                  if (pbVar26[1] == 0) {
                    pbVar26 = pbVar26 + 2;
                  }
                  else {
                    uVar13 = (uint)pbVar26[1];
                    cinfo->unread_marker = uVar13;
                    lVar10 = lVar8 * 0x100;
                  }
                }
                else {
                  pbVar26 = pbVar26 + 1;
                }
                lVar8 = lVar10 * 0x100 + (ulong)*pbVar26;
                if ((ulong)*pbVar26 == 0xff) {
                  if (pbVar26[1] == 0) {
                    pbVar26 = pbVar26 + 2;
                  }
                  else {
                    uVar13 = (uint)pbVar26[1];
                    cinfo->unread_marker = uVar13;
                    lVar8 = lVar10 * 0x100;
                  }
                }
                else {
                  pbVar26 = pbVar26 + 1;
                }
                p_Var14 = (_func_void_j_decompress_ptr *)(lVar8 * 0x100) + *pbVar26;
                iVar12 = iVar12 + 0x30;
                if ((ulong)*pbVar26 == 0xff) {
                  if (pbVar26[1] == 0) {
                    pbVar26 = pbVar26 + 2;
                  }
                  else {
                    uVar13 = (uint)pbVar26[1];
                    cinfo->unread_marker = uVar13;
                    p_Var14 = (_func_void_j_decompress_ptr *)(lVar8 * 0x100);
                  }
                }
                else {
                  pbVar26 = pbVar26 + 1;
                }
              }
              uVar16 = *(uint *)(lVar5 + 0x128 +
                                (ulong)((uint)((ulong)p_Var14 >> ((char)iVar12 - 8U & 0x3f)) & 0xff)
                                * 4);
              uVar19 = (int)uVar16 >> 8;
              iVar7 = iVar12 - uVar19;
              if ((int)uVar19 < 9) {
                uVar16 = uVar16 & 0xff;
                iVar12 = iVar7;
              }
              else {
                uVar16 = (uint)((ulong)p_Var14 >> ((byte)iVar7 & 0x3f)) &
                         ~(-1 << ((byte)(uVar16 >> 8) & 0x1f));
                uVar15 = (ulong)uVar16;
                uVar9 = (ulong)uVar19;
                if (*(long *)(lVar5 + uVar9 * 8) < (long)uVar15) {
                  uVar19 = ~uVar19;
                  uVar11 = uVar9;
                  do {
                    uVar16 = (uint)(((ulong)p_Var14 >> ((ulong)(iVar12 + uVar19) & 0x3f) & 1) != 0)
                             + (int)uVar15 * 2;
                    uVar15 = (ulong)uVar16;
                    uVar9 = uVar11 + 1;
                    uVar19 = uVar19 - 1;
                    lVar8 = uVar11 * 8;
                    uVar11 = uVar9;
                  } while (*(long *)(lVar5 + 8 + lVar8) < (long)(int)uVar16);
                  uVar19 = (uint)uVar9;
                  iVar7 = iVar12 - uVar19;
                }
                iVar12 = iVar7;
                if (0x10 < (int)uVar19) break;
                uVar16 = (uint)*(byte *)(*(long *)(lVar5 + 0x120) + 0x11 +
                                        (ulong)(uVar16 + *(int *)(lVar5 + 0x90 + uVar9 * 8) & 0xff))
                ;
              }
              uVar19 = uVar16 & 0xf;
              if (uVar19 == 0) {
                if (uVar16 >> 4 != 0xf) break;
                iVar7 = iVar20 + 0xf;
              }
              else {
                if (iVar12 < 0x11) {
                  lVar8 = (long)p_Var14 * 0x100 + (ulong)*pbVar26;
                  if ((ulong)*pbVar26 == 0xff) {
                    if (pbVar26[1] == 0) {
                      pbVar26 = pbVar26 + 2;
                    }
                    else {
                      uVar13 = (uint)pbVar26[1];
                      cinfo->unread_marker = uVar13;
                      lVar8 = (long)p_Var14 * 0x100;
                    }
                  }
                  else {
                    pbVar26 = pbVar26 + 1;
                  }
                  lVar10 = lVar8 * 0x100 + (ulong)*pbVar26;
                  if ((ulong)*pbVar26 == 0xff) {
                    if (pbVar26[1] == 0) {
                      pbVar26 = pbVar26 + 2;
                    }
                    else {
                      uVar13 = (uint)pbVar26[1];
                      cinfo->unread_marker = uVar13;
                      lVar10 = lVar8 * 0x100;
                    }
                  }
                  else {
                    pbVar26 = pbVar26 + 1;
                  }
                  lVar8 = lVar10 * 0x100 + (ulong)*pbVar26;
                  if ((ulong)*pbVar26 == 0xff) {
                    if (pbVar26[1] == 0) {
                      pbVar26 = pbVar26 + 2;
                    }
                    else {
                      uVar13 = (uint)pbVar26[1];
                      cinfo->unread_marker = uVar13;
                      lVar8 = lVar10 * 0x100;
                    }
                  }
                  else {
                    pbVar26 = pbVar26 + 1;
                  }
                  lVar10 = lVar8 * 0x100 + (ulong)*pbVar26;
                  if ((ulong)*pbVar26 == 0xff) {
                    if (pbVar26[1] == 0) {
                      pbVar26 = pbVar26 + 2;
                    }
                    else {
                      uVar13 = (uint)pbVar26[1];
                      cinfo->unread_marker = uVar13;
                      lVar10 = lVar8 * 0x100;
                    }
                  }
                  else {
                    pbVar26 = pbVar26 + 1;
                  }
                  lVar8 = lVar10 * 0x100 + (ulong)*pbVar26;
                  if ((ulong)*pbVar26 == 0xff) {
                    if (pbVar26[1] == 0) {
                      pbVar26 = pbVar26 + 2;
                    }
                    else {
                      uVar13 = (uint)pbVar26[1];
                      cinfo->unread_marker = uVar13;
                      lVar8 = lVar10 * 0x100;
                    }
                  }
                  else {
                    pbVar26 = pbVar26 + 1;
                  }
                  p_Var14 = (_func_void_j_decompress_ptr *)(lVar8 * 0x100) + *pbVar26;
                  iVar12 = iVar12 + 0x30;
                  if ((ulong)*pbVar26 == 0xff) {
                    if (pbVar26[1] == 0) {
                      pbVar26 = pbVar26 + 2;
                    }
                    else {
                      uVar13 = (uint)pbVar26[1];
                      cinfo->unread_marker = uVar13;
                      p_Var14 = (_func_void_j_decompress_ptr *)(lVar8 * 0x100);
                    }
                  }
                  else {
                    pbVar26 = pbVar26 + 1;
                  }
                }
                iVar12 = iVar12 - uVar19;
                iVar7 = (uVar16 >> 4) + iVar20;
                uVar16 = -1 << (sbyte)uVar19;
                uVar24 = ~uVar16 & (uint)((ulong)p_Var14 >> ((byte)iVar12 & 0x3f));
                (*paJVar21)[jpeg_natural_order[iVar7]] =
                     ((ushort)((int)((-1 << ((sbyte)uVar19 - 1U & 0x1f)) + uVar24) >> 0x1f) &
                     ((ushort)uVar16 | 1)) + (short)uVar24;
              }
              iVar20 = iVar7 + 1;
            } while (iVar7 < 0x3f);
          }
          else {
            iVar20 = iVar20 + *(int *)((long)&local_98.next_input_byte +
                                      (long)cinfo->MCU_membership[lVar22] * 4);
            *(int *)((long)&local_98.next_input_byte + (long)cinfo->MCU_membership[lVar22] * 4) =
                 iVar20;
            if (paJVar21 != (JBLOCKROW)0x0) {
              (*paJVar21)[0] = (JCOEF)iVar20;
              goto LAB_0014287c;
            }
LAB_00142c52:
            iVar20 = 1;
            do {
              if (iVar12 < 0x11) {
                lVar8 = (long)p_Var14 * 0x100 + (ulong)*pbVar26;
                if ((ulong)*pbVar26 == 0xff) {
                  if (pbVar26[1] == 0) {
                    pbVar26 = pbVar26 + 2;
                  }
                  else {
                    uVar13 = (uint)pbVar26[1];
                    cinfo->unread_marker = uVar13;
                    lVar8 = (long)p_Var14 * 0x100;
                  }
                }
                else {
                  pbVar26 = pbVar26 + 1;
                }
                lVar10 = lVar8 * 0x100 + (ulong)*pbVar26;
                if ((ulong)*pbVar26 == 0xff) {
                  if (pbVar26[1] == 0) {
                    pbVar26 = pbVar26 + 2;
                  }
                  else {
                    uVar13 = (uint)pbVar26[1];
                    cinfo->unread_marker = uVar13;
                    lVar10 = lVar8 * 0x100;
                  }
                }
                else {
                  pbVar26 = pbVar26 + 1;
                }
                lVar8 = lVar10 * 0x100 + (ulong)*pbVar26;
                if ((ulong)*pbVar26 == 0xff) {
                  if (pbVar26[1] == 0) {
                    pbVar26 = pbVar26 + 2;
                  }
                  else {
                    uVar13 = (uint)pbVar26[1];
                    cinfo->unread_marker = uVar13;
                    lVar8 = lVar10 * 0x100;
                  }
                }
                else {
                  pbVar26 = pbVar26 + 1;
                }
                lVar10 = lVar8 * 0x100 + (ulong)*pbVar26;
                if ((ulong)*pbVar26 == 0xff) {
                  if (pbVar26[1] == 0) {
                    pbVar26 = pbVar26 + 2;
                  }
                  else {
                    uVar13 = (uint)pbVar26[1];
                    cinfo->unread_marker = uVar13;
                    lVar10 = lVar8 * 0x100;
                  }
                }
                else {
                  pbVar26 = pbVar26 + 1;
                }
                lVar8 = lVar10 * 0x100 + (ulong)*pbVar26;
                if ((ulong)*pbVar26 == 0xff) {
                  if (pbVar26[1] == 0) {
                    pbVar26 = pbVar26 + 2;
                  }
                  else {
                    uVar13 = (uint)pbVar26[1];
                    cinfo->unread_marker = uVar13;
                    lVar8 = lVar10 * 0x100;
                  }
                }
                else {
                  pbVar26 = pbVar26 + 1;
                }
                p_Var14 = (_func_void_j_decompress_ptr *)(lVar8 * 0x100) + *pbVar26;
                iVar12 = iVar12 + 0x30;
                if ((ulong)*pbVar26 == 0xff) {
                  if (pbVar26[1] == 0) {
                    pbVar26 = pbVar26 + 2;
                  }
                  else {
                    uVar13 = (uint)pbVar26[1];
                    cinfo->unread_marker = uVar13;
                    p_Var14 = (_func_void_j_decompress_ptr *)(lVar8 * 0x100);
                  }
                }
                else {
                  pbVar26 = pbVar26 + 1;
                }
              }
              uVar16 = *(uint *)(lVar5 + 0x128 +
                                (ulong)((uint)((ulong)p_Var14 >> ((char)iVar12 - 8U & 0x3f)) & 0xff)
                                * 4);
              uVar19 = (int)uVar16 >> 8;
              iVar7 = iVar12 - uVar19;
              if ((int)uVar19 < 9) {
                uVar16 = uVar16 & 0xff;
                iVar12 = iVar7;
              }
              else {
                uVar16 = (uint)((ulong)p_Var14 >> ((byte)iVar7 & 0x3f)) &
                         ~(-1 << ((byte)(uVar16 >> 8) & 0x1f));
                uVar15 = (ulong)uVar16;
                uVar9 = (ulong)uVar19;
                if (*(long *)(lVar5 + uVar9 * 8) < (long)uVar15) {
                  uVar19 = ~uVar19;
                  uVar11 = uVar9;
                  do {
                    uVar16 = (uint)(((ulong)p_Var14 >> ((ulong)(iVar12 + uVar19) & 0x3f) & 1) != 0)
                             + (int)uVar15 * 2;
                    uVar15 = (ulong)uVar16;
                    uVar9 = uVar11 + 1;
                    uVar19 = uVar19 - 1;
                    lVar8 = uVar11 * 8;
                    uVar11 = uVar9;
                  } while (*(long *)(lVar5 + 8 + lVar8) < (long)(int)uVar16);
                  uVar19 = (uint)uVar9;
                  iVar7 = iVar12 - uVar19;
                }
                iVar12 = iVar7;
                if (0x10 < (int)uVar19) break;
                uVar16 = (uint)*(byte *)(*(long *)(lVar5 + 0x120) + 0x11 +
                                        (ulong)(uVar16 + *(int *)(lVar5 + 0x90 + uVar9 * 8) & 0xff))
                ;
              }
              if ((uVar16 & 0xf) == 0) {
                if (uVar16 >> 4 != 0xf) break;
              }
              else {
                if (iVar12 < 0x11) {
                  lVar8 = (long)p_Var14 * 0x100 + (ulong)*pbVar26;
                  if ((ulong)*pbVar26 == 0xff) {
                    if (pbVar26[1] == 0) {
                      pbVar26 = pbVar26 + 2;
                    }
                    else {
                      uVar13 = (uint)pbVar26[1];
                      cinfo->unread_marker = uVar13;
                      lVar8 = (long)p_Var14 * 0x100;
                    }
                  }
                  else {
                    pbVar26 = pbVar26 + 1;
                  }
                  lVar10 = lVar8 * 0x100 + (ulong)*pbVar26;
                  if ((ulong)*pbVar26 == 0xff) {
                    if (pbVar26[1] == 0) {
                      pbVar26 = pbVar26 + 2;
                    }
                    else {
                      uVar13 = (uint)pbVar26[1];
                      cinfo->unread_marker = uVar13;
                      lVar10 = lVar8 * 0x100;
                    }
                  }
                  else {
                    pbVar26 = pbVar26 + 1;
                  }
                  lVar8 = lVar10 * 0x100 + (ulong)*pbVar26;
                  if ((ulong)*pbVar26 == 0xff) {
                    if (pbVar26[1] == 0) {
                      pbVar26 = pbVar26 + 2;
                    }
                    else {
                      uVar13 = (uint)pbVar26[1];
                      cinfo->unread_marker = uVar13;
                      lVar8 = lVar10 * 0x100;
                    }
                  }
                  else {
                    pbVar26 = pbVar26 + 1;
                  }
                  lVar10 = lVar8 * 0x100 + (ulong)*pbVar26;
                  if ((ulong)*pbVar26 == 0xff) {
                    if (pbVar26[1] == 0) {
                      pbVar26 = pbVar26 + 2;
                    }
                    else {
                      uVar13 = (uint)pbVar26[1];
                      cinfo->unread_marker = uVar13;
                      lVar10 = lVar8 * 0x100;
                    }
                  }
                  else {
                    pbVar26 = pbVar26 + 1;
                  }
                  lVar8 = lVar10 * 0x100 + (ulong)*pbVar26;
                  if ((ulong)*pbVar26 == 0xff) {
                    if (pbVar26[1] == 0) {
                      pbVar26 = pbVar26 + 2;
                    }
                    else {
                      uVar13 = (uint)pbVar26[1];
                      cinfo->unread_marker = uVar13;
                      lVar8 = lVar10 * 0x100;
                    }
                  }
                  else {
                    pbVar26 = pbVar26 + 1;
                  }
                  p_Var14 = (_func_void_j_decompress_ptr *)(lVar8 * 0x100) + *pbVar26;
                  iVar12 = iVar12 + 0x30;
                  if ((ulong)*pbVar26 == 0xff) {
                    if (pbVar26[1] == 0) {
                      pbVar26 = pbVar26 + 2;
                    }
                    else {
                      uVar13 = (uint)pbVar26[1];
                      cinfo->unread_marker = uVar13;
                      p_Var14 = (_func_void_j_decompress_ptr *)(lVar8 * 0x100);
                    }
                  }
                  else {
                    pbVar26 = pbVar26 + 1;
                  }
                }
                iVar12 = iVar12 - (uVar16 & 0xf);
              }
              iVar20 = iVar20 + (uVar16 >> 4) + 1;
            } while (iVar20 < 0x40);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != iVar18);
        if (uVar13 != 0) {
          cinfo->unread_marker = 0;
          local_98.bytes_in_buffer = local_38;
          pjVar23 = local_40;
          MCU_data = local_60;
          goto LAB_00142008;
        }
      }
      local_40->next_input_byte = pbVar26;
      local_40->bytes_in_buffer = (size_t)(pbVar25 + (local_38 - (long)pbVar26));
      pjVar17[1].start_pass = p_Var14;
      *(int *)&pjVar17[1].decode_mcu = iVar12;
      *(JOCTET **)&pjVar17[1].insufficient_data = local_98.next_input_byte;
      pjVar17[2].start_pass = (_func_void_j_decompress_ptr *)local_98.bytes_in_buffer;
      goto LAB_00142444;
    }
  }
LAB_00142008:
  local_98.cinfo = cinfo;
  local_98.next_input_byte = pbVar25;
  p_Var14 = pjVar17[1].start_pass;
  iVar12 = *(int *)&pjVar17[1].decode_mcu;
  local_58 = *(undefined8 *)&pjVar17[1].insufficient_data;
  p_Stack_50 = pjVar17[2].start_pass;
  if (0 < iVar18) {
    lVar22 = 0;
    local_60 = MCU_data;
    do {
      if (local_60 == (JBLOCKROW *)0x0) {
        local_a8 = (JBLOCKROW)0x0;
      }
      else {
        local_a8 = local_60[lVar22];
      }
      htbl = (d_derived_tbl *)(&pjVar17[5].decode_mcu)[lVar22];
      htbl_00 = *(d_derived_tbl **)(&pjVar17[8].insufficient_data + lVar22 * 2);
      if (iVar12 < 8) {
        bVar6 = jpeg_fill_bit_buffer(&local_98,(bit_buf_type)p_Var14,iVar12,0);
        if (bVar6 == 0) {
          return 0;
        }
        iVar18 = 1;
        p_Var14 = (_func_void_j_decompress_ptr *)local_98.get_buffer;
        iVar12 = local_98.bits_left;
        if (7 < local_98.bits_left) goto LAB_001420a4;
LAB_001420cd:
        uVar13 = jpeg_huff_decode(&local_98,(bit_buf_type)p_Var14,iVar12,htbl,iVar18);
        p_Var14 = (_func_void_j_decompress_ptr *)local_98.get_buffer;
        iVar12 = local_98.bits_left;
        if ((int)uVar13 < 0) {
          return 0;
        }
      }
      else {
LAB_001420a4:
        uVar13 = htbl->lookup[(ulong)p_Var14 >> ((char)iVar12 - 8U & 0x3f) & 0xff];
        iVar18 = (int)uVar13 >> 8;
        if (8 < iVar18) goto LAB_001420cd;
        uVar13 = uVar13 & 0xff;
        iVar12 = iVar12 - iVar18;
      }
      if (uVar13 == 0) {
        iVar18 = 0;
      }
      else {
        if ((iVar12 < (int)uVar13) &&
           (bVar6 = jpeg_fill_bit_buffer(&local_98,(bit_buf_type)p_Var14,iVar12,uVar13),
           p_Var14 = (_func_void_j_decompress_ptr *)local_98.get_buffer, iVar12 = local_98.bits_left
           , bVar6 == 0)) {
          return 0;
        }
        iVar12 = iVar12 - uVar13;
        uVar16 = -1 << ((byte)uVar13 & 0x1f);
        uVar19 = ~uVar16 & (uint)((ulong)p_Var14 >> ((byte)iVar12 & 0x3f));
        iVar18 = ((int)((-1 << ((byte)uVar13 - 1 & 0x1f)) + uVar19) >> 0x1f & uVar16 + 1) + uVar19;
      }
      if (*(int *)((long)&pjVar17[0xc].start_pass + lVar22 * 4) == 0) {
LAB_00142185:
        if (((&pjVar17[0xd].insufficient_data)[lVar22] == 0) || (local_a8 == (JBLOCKROW)0x0))
        goto LAB_001422b9;
        iVar18 = 1;
        do {
          if (iVar12 < 8) {
            bVar6 = jpeg_fill_bit_buffer(&local_98,(bit_buf_type)p_Var14,iVar12,0);
            if (bVar6 == 0) {
              return 0;
            }
            iVar20 = 1;
            p_Var14 = (_func_void_j_decompress_ptr *)local_98.get_buffer;
            iVar12 = local_98.bits_left;
            if (7 < local_98.bits_left) goto LAB_001421d1;
LAB_001421fa:
            uVar13 = jpeg_huff_decode(&local_98,(bit_buf_type)p_Var14,iVar12,htbl_00,iVar20);
            p_Var14 = (_func_void_j_decompress_ptr *)local_98.get_buffer;
            iVar12 = local_98.bits_left;
            if ((int)uVar13 < 0) {
              return 0;
            }
          }
          else {
LAB_001421d1:
            iVar20 = htbl_00->lookup[(ulong)p_Var14 >> ((char)iVar12 - 8U & 0x3f) & 0xff] >> 8;
            if (8 < iVar20) goto LAB_001421fa;
            uVar13 = htbl_00->lookup[(ulong)p_Var14 >> ((char)iVar12 - 8U & 0x3f) & 0xff] & 0xff;
            iVar12 = iVar12 - iVar20;
          }
          uVar16 = uVar13 & 0xf;
          if (uVar16 == 0) {
            if (uVar13 >> 4 != 0xf) break;
            iVar20 = iVar18 + 0xf;
          }
          else {
            if ((iVar12 < (int)uVar16) &&
               (bVar6 = jpeg_fill_bit_buffer(&local_98,(bit_buf_type)p_Var14,iVar12,uVar16),
               p_Var14 = (_func_void_j_decompress_ptr *)local_98.get_buffer,
               iVar12 = local_98.bits_left, bVar6 == 0)) {
              return 0;
            }
            iVar12 = iVar12 - uVar16;
            iVar20 = (uVar13 >> 4) + iVar18;
            uVar13 = -1 << (sbyte)uVar16;
            uVar19 = ~uVar13 & (uint)((ulong)p_Var14 >> ((byte)iVar12 & 0x3f));
            (*local_a8)[jpeg_natural_order[iVar20]] =
                 ((ushort)((int)((-1 << ((sbyte)uVar16 - 1U & 0x1f)) + uVar19) >> 0x1f) &
                 ((ushort)uVar13 | 1)) + (short)uVar19;
          }
          iVar18 = iVar20 + 1;
        } while (iVar20 < 0x3f);
      }
      else {
        iVar18 = iVar18 + *(int *)((long)&local_58 + (long)cinfo->MCU_membership[lVar22] * 4);
        *(int *)((long)&local_58 + (long)cinfo->MCU_membership[lVar22] * 4) = iVar18;
        if (local_a8 != (JBLOCKROW)0x0) {
          (*local_a8)[0] = (JCOEF)iVar18;
          goto LAB_00142185;
        }
LAB_001422b9:
        iVar18 = 1;
        do {
          if (iVar12 < 8) {
            bVar6 = jpeg_fill_bit_buffer(&local_98,(bit_buf_type)p_Var14,iVar12,0);
            if (bVar6 == 0) {
              return 0;
            }
            iVar20 = 1;
            p_Var14 = (_func_void_j_decompress_ptr *)local_98.get_buffer;
            iVar12 = local_98.bits_left;
            if (7 < local_98.bits_left) goto LAB_001422ea;
LAB_00142313:
            uVar13 = jpeg_huff_decode(&local_98,(bit_buf_type)p_Var14,iVar12,htbl_00,iVar20);
            p_Var14 = (_func_void_j_decompress_ptr *)local_98.get_buffer;
            iVar12 = local_98.bits_left;
            if ((int)uVar13 < 0) {
              return 0;
            }
          }
          else {
LAB_001422ea:
            iVar20 = htbl_00->lookup[(ulong)p_Var14 >> ((char)iVar12 - 8U & 0x3f) & 0xff] >> 8;
            if (8 < iVar20) goto LAB_00142313;
            uVar13 = htbl_00->lookup[(ulong)p_Var14 >> ((char)iVar12 - 8U & 0x3f) & 0xff] & 0xff;
            iVar12 = iVar12 - iVar20;
          }
          uVar16 = uVar13 & 0xf;
          if (uVar16 == 0) {
            if (uVar13 >> 4 != 0xf) break;
          }
          else {
            if ((iVar12 < (int)uVar16) &&
               (bVar6 = jpeg_fill_bit_buffer(&local_98,(bit_buf_type)p_Var14,iVar12,uVar16),
               p_Var14 = (_func_void_j_decompress_ptr *)local_98.get_buffer,
               iVar12 = local_98.bits_left, bVar6 == 0)) {
              return 0;
            }
            iVar12 = iVar12 - uVar16;
          }
          iVar18 = iVar18 + (uVar13 >> 4) + 1;
        } while (iVar18 < 0x40);
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < cinfo->blocks_in_MCU);
    pjVar23 = cinfo->src;
  }
  pjVar23->next_input_byte = local_98.next_input_byte;
  pjVar23->bytes_in_buffer = local_98.bytes_in_buffer;
  pjVar17[1].start_pass = p_Var14;
  *(int *)&pjVar17[1].decode_mcu = iVar12;
  *(undefined8 *)&pjVar17[1].insufficient_data = local_58;
  pjVar17[2].start_pass = p_Stack_50;
LAB_00142444:
  if (cinfo->restart_interval != 0) {
    *(int *)&local_68[2].decode_mcu = *(int *)&local_68[2].decode_mcu + -1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  jpeg_component_info *compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign, k;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;   /* if error do nothing */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data ? MCU_data[blkn] : NULL;
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2;  st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
        st = entropy->dc_stats[tbl] + 20;       /* Table F.4: X1 = 20 */
        while (arith_decode(cinfo, st)) {
          if ((m <<= 1) == 0x8000) {
            WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
            entropy->ct = -1;                   /* magnitude overflow */
            return TRUE;
          }
          st += 1;
        }
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int)((1L << cinfo->arith_dc_L[tbl]) >> 1))
        entropy->dc_context[ci] = 0;               /* zero diff category */
      else if (m > (int)((1L << cinfo->arith_dc_U[tbl]) >> 1))
        entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
        entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        if (arith_decode(cinfo, st)) v |= m;
      v += 1;  if (sign) v = -v;
      entropy->last_dc_val[ci] = (entropy->last_dc_val[ci] + v) & 0xffff;
    }

    if (block)
      (*block)[0] = (JCOEF)entropy->last_dc_val[ci];

    /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

    tbl = compptr->ac_tbl_no;

    /* Figure F.20: Decode_AC_coefficients */
    for (k = 1; k <= DCTSIZE2 - 1; k++) {
      st = entropy->ac_stats[tbl] + 3 * (k - 1);
      if (arith_decode(cinfo, st)) break;       /* EOB flag */
      while (arith_decode(cinfo, st + 1) == 0) {
        st += 3;  k++;
        if (k > DCTSIZE2 - 1) {
          WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
          entropy->ct = -1;                     /* spectral overflow */
          return TRUE;
        }
      }
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, entropy->fixed_bin);
      st += 2;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
        if (arith_decode(cinfo, st)) {
          m <<= 1;
          st = entropy->ac_stats[tbl] +
               (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
          while (arith_decode(cinfo, st)) {
            if ((m <<= 1) == 0x8000) {
              WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
              entropy->ct = -1;                 /* magnitude overflow */
              return TRUE;
            }
            st += 1;
          }
        }
      }
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        if (arith_decode(cinfo, st)) v |= m;
      v += 1;  if (sign) v = -v;
      if (block)
        (*block)[jpeg_natural_order[k]] = (JCOEF)v;
    }
  }

  return TRUE;
}